

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::unwind_to(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *ptr)

{
  chunk *pcVar1;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  
  pcVar1 = this->current_chunk_;
  psVar2 = this->begin_;
  if ((ptr < psVar2) || (this->end_ <= ptr)) {
    do {
      pcVar1->curr_ = psVar2;
      pcVar1 = pcVar1->back_;
      psVar2 = pcVar1->begin_;
    } while (pcVar1->end_ <= ptr || ptr < psVar2);
    this->end_ = pcVar1->end_;
    this->current_chunk_ = pcVar1;
    this->begin_ = psVar2;
  }
  this->curr_ = ptr;
  pcVar1->curr_ = ptr;
  return;
}

Assistant:

void unwind_to(T *ptr)
    {
        while(!this->in_current_chunk(ptr))
        {
            // completely unwind the current chunk, move to the previous chunk
            this->unwind_chunk_();
        }
        this->current_chunk_->curr_ = this->curr_ = ptr;
    }